

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O1

void Map_LibraryComputeTruth_rec
               (Map_SuperLib_t *pLib,char *pFormula,uint (*uTruthsIn) [2],uint *uTruthRes)

{
  char *pName;
  Mio_Gate_t *pGate;
  char *pcVar1;
  long lVar2;
  int nStrings;
  uint uTruthsFanins [6] [2];
  char *pStrings [6];
  uint local_9c;
  uint local_98 [12];
  char *local_68 [7];
  
  pName = Map_LibraryReadFormulaStep(pFormula,local_68,(int *)&local_9c);
  if ((ulong)local_9c == 0) {
    if (pLib->nVarsMax <= *pName + -0x61) {
      __assert_fail("pGateName[0] - \'a\' < pLib->nVarsMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                    ,0x178,
                    "void Map_LibraryComputeTruth_rec(Map_SuperLib_t *, char *, unsigned int (*)[2], unsigned int *)"
                   );
    }
    *uTruthRes = uTruthsIn[(long)(int)*pName + -0x61][0];
    uTruthRes[1] = uTruthsIn[(long)*pName + -0x61][1];
  }
  else {
    if (0 < (int)local_9c) {
      lVar2 = 0;
      do {
        Map_LibraryComputeTruth_rec
                  (pLib,*(char **)((long)local_68 + lVar2),uTruthsIn,
                   (uint *)((long)local_98 + lVar2));
        lVar2 = lVar2 + 8;
      } while ((ulong)local_9c * 8 - lVar2 != 0);
    }
    pGate = Mio_LibraryReadGateByName(pLib->pGenlib,pName,(char *)0x0);
    if (pGate == (Mio_Gate_t *)0x0) {
      pcVar1 = Mio_LibraryReadName(pLib->pGenlib);
      printf("A supergate contains gate \"%s\" that is not in \"%s\".\n",pName,pcVar1);
    }
    Mio_DeriveTruthTable(pGate,(uint (*) [2])local_98,local_9c,pLib->nVarsMax,uTruthRes);
  }
  return;
}

Assistant:

void Map_LibraryComputeTruth_rec( Map_SuperLib_t * pLib, char * pFormula, unsigned uTruthsIn[][2], unsigned uTruthRes[] )
{
    Mio_Gate_t * pMioGate;
    char * pGateName, * pStrings[6];
    unsigned uTruthsFanins[6][2];
    int nStrings, i;

    // perform one step parsing of the formula
    // detect the root gate name, the next-step strings, and their number
    pGateName = Map_LibraryReadFormulaStep( pFormula, pStrings, &nStrings );
    if ( nStrings == 0 ) // elementary variable
    {
        assert( pGateName[0] - 'a' < pLib->nVarsMax );
        uTruthRes[0] = uTruthsIn[pGateName[0] - 'a'][0];
        uTruthRes[1] = uTruthsIn[pGateName[0] - 'a'][1];
        return;
    }
    // derive the functionality of the fanins
    for ( i = 0; i < nStrings; i++ )
        Map_LibraryComputeTruth_rec( pLib, pStrings[i], uTruthsIn, uTruthsFanins[i] );
    // get the root supergate
    pMioGate = Mio_LibraryReadGateByName( pLib->pGenlib, pGateName, NULL );
    if ( pMioGate == NULL )
        printf( "A supergate contains gate \"%s\" that is not in \"%s\".\n", pGateName, Mio_LibraryReadName(pLib->pGenlib) ); 
    // derive the functionality of the output of the supergate
    Mio_DeriveTruthTable( pMioGate, uTruthsFanins, nStrings, pLib->nVarsMax, uTruthRes );
}